

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Track::AddContentEncoding(Track *this)

{
  ContentEncoding **ppCVar1;
  uint32_t i;
  ContentEncoding **ppCVar2;
  ContentEncoding *pCVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)this->content_encoding_entries_size_;
  uVar5 = this->content_encoding_entries_size_ + 1;
  ppCVar2 = (ContentEncoding **)operator_new__((ulong)uVar5 * 8,(nothrow_t *)&std::nothrow);
  if (ppCVar2 != (ContentEncoding **)0x0) {
    pCVar3 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    if (pCVar3 != (ContentEncoding *)0x0) {
      pCVar3->enc_algo_ = 5;
      pCVar3->enc_key_id_ = (uint8_t *)0x0;
      pCVar3->encoding_order_ = 0;
      pCVar3->encoding_scope_ = 1;
      pCVar3->encoding_type_ = 1;
      (pCVar3->enc_aes_settings_).cipher_mode_ = 1;
      pCVar3->enc_key_id_length_ = 0;
      ppCVar1 = this->content_encoding_entries_;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        ppCVar2[uVar4] = ppCVar1[uVar4];
      }
      if (ppCVar1 != (ContentEncoding **)0x0) {
        operator_delete__(ppCVar1);
        uVar6 = (ulong)this->content_encoding_entries_size_;
      }
      this->content_encoding_entries_ = ppCVar2;
      ppCVar2[uVar6] = pCVar3;
      this->content_encoding_entries_size_ = uVar5;
      return true;
    }
    operator_delete__(ppCVar2);
  }
  return false;
}

Assistant:

bool Track::AddContentEncoding() {
  const uint32_t count = content_encoding_entries_size_ + 1;

  ContentEncoding** const content_encoding_entries =
      new (std::nothrow) ContentEncoding*[count];  // NOLINT
  if (!content_encoding_entries)
    return false;

  ContentEncoding* const content_encoding =
      new (std::nothrow) ContentEncoding();  // NOLINT
  if (!content_encoding) {
    delete[] content_encoding_entries;
    return false;
  }

  for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
    content_encoding_entries[i] = content_encoding_entries_[i];
  }

  delete[] content_encoding_entries_;

  content_encoding_entries_ = content_encoding_entries;
  content_encoding_entries_[content_encoding_entries_size_] = content_encoding;
  content_encoding_entries_size_ = count;
  return true;
}